

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_v8m_stackcheck_aarch64(CPUARMState_conflict *env,uint32_t newvalue)

{
  ulong uVar1;
  long lVar2;
  CPUARMState_conflict *__mptr;
  uintptr_t unaff_retaddr;
  
  if ((env->v7m).exception == 0) {
    uVar1 = (ulong)(env->v7m).secure;
    lVar2 = (ulong)(((byte)(env->v7m).control[uVar1] & 2) >> 1) * 8 + 0xb9c;
  }
  else {
    uVar1 = (ulong)(env->v7m).secure;
    lVar2 = 0xb9c;
  }
  if (*(uint *)((long)env->regs + uVar1 * 4 + lVar2) <= newvalue) {
    return;
  }
  cpu_restore_state_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),unaff_retaddr,true);
  raise_exception_aarch64(env,0x13,0,1);
}

Assistant:

void HELPER(v8m_stackcheck)(CPUARMState *env, uint32_t newvalue)
{
    /*
     * Perform the v8M stack limit check for SP updates from translated code,
     * raising an exception if the limit is breached.
     */
    if (newvalue < v7m_sp_limit(env)) {
        CPUState *cs = env_cpu(env);

        /*
         * Stack limit exceptions are a rare case, so rather than syncing
         * PC/condbits before the call, we use cpu_restore_state() to
         * get them right before raising the exception.
         */
        cpu_restore_state(cs, GETPC(), true);
        raise_exception(env, EXCP_STKOF, 0, 1);
    }
}